

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O3

void tgt_destroy(opj_tgt_tree_t *p_tree)

{
  if (p_tree != (opj_tgt_tree_t *)0x0) {
    if (p_tree->nodes != (opj_tgt_node_t *)0x0) {
      free(p_tree->nodes);
    }
    free(p_tree);
    return;
  }
  return;
}

Assistant:

void tgt_destroy(opj_tgt_tree_t *p_tree)
{
	if (! p_tree) {
		return;
	}

	if (p_tree->nodes) {
		opj_free(p_tree->nodes);
		p_tree->nodes = 00;
	}
	opj_free(p_tree);
}